

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O1

int Curl_getaddrinfo_ex(char *nodename,char *servname,addrinfo *hints,Curl_addrinfo **result)

{
  sockaddr *psVar1;
  undefined8 uVar2;
  char cVar3;
  char cVar4;
  char cVar5;
  char cVar6;
  char cVar7;
  char cVar8;
  int iVar9;
  Curl_addrinfo *pCVar10;
  sockaddr *psVar11;
  char *pcVar12;
  Curl_addrinfo *pCVar13;
  addrinfo *paVar14;
  Curl_addrinfo *pCVar15;
  bool bVar16;
  addrinfo *aihead;
  addrinfo *local_38;
  
  *result = (Curl_addrinfo *)0x0;
  iVar9 = getaddrinfo(nodename,servname,(addrinfo *)hints,&local_38);
  if (iVar9 == 0) {
    bVar16 = local_38 == (addrinfo *)0x0;
    if (bVar16) {
      pCVar15 = (Curl_addrinfo *)0x0;
      iVar9 = 0;
    }
    else {
      pCVar13 = (Curl_addrinfo *)0x0;
      pCVar15 = (Curl_addrinfo *)0x0;
      paVar14 = local_38;
      do {
        pCVar10 = pCVar13;
        if (((paVar14->ai_family == 2) && (paVar14->ai_addr != (sockaddr *)0x0)) &&
           (0xf < paVar14->ai_addrlen)) {
          pCVar10 = (Curl_addrinfo *)(*Curl_cmalloc)(0x30);
          if (pCVar10 != (Curl_addrinfo *)0x0) {
            pCVar10->ai_flags = paVar14->ai_flags;
            pCVar10->ai_family = paVar14->ai_family;
            pCVar10->ai_socktype = paVar14->ai_socktype;
            pCVar10->ai_protocol = paVar14->ai_protocol;
            pCVar10->ai_addrlen = 0x10;
            pCVar10->ai_canonname = (char *)0x0;
            pCVar10->ai_addr = (sockaddr *)0x0;
            pCVar10->ai_next = (Curl_addrinfo *)0x0;
            psVar11 = (sockaddr *)(*Curl_cmalloc)(0x10);
            pCVar10->ai_addr = psVar11;
            if (psVar11 != (sockaddr *)0x0) {
              psVar1 = paVar14->ai_addr;
              cVar3 = psVar1->sa_data[0];
              cVar4 = psVar1->sa_data[1];
              cVar5 = psVar1->sa_data[2];
              cVar6 = psVar1->sa_data[3];
              cVar7 = psVar1->sa_data[4];
              cVar8 = psVar1->sa_data[5];
              uVar2 = *(undefined8 *)(psVar1->sa_data + 6);
              psVar11->sa_family = psVar1->sa_family;
              psVar11->sa_data[0] = cVar3;
              psVar11->sa_data[1] = cVar4;
              psVar11->sa_data[2] = cVar5;
              psVar11->sa_data[3] = cVar6;
              psVar11->sa_data[4] = cVar7;
              psVar11->sa_data[5] = cVar8;
              *(undefined8 *)(psVar11->sa_data + 6) = uVar2;
              if (paVar14->ai_canonname != (char *)0x0) {
                pcVar12 = (*Curl_cstrdup)(paVar14->ai_canonname);
                pCVar10->ai_canonname = pcVar12;
                if (pcVar12 == (char *)0x0) {
                  (*Curl_cfree)(pCVar10->ai_addr);
                  goto LAB_005272ac;
                }
              }
              if (pCVar15 == (Curl_addrinfo *)0x0) {
                pCVar15 = pCVar10;
              }
              if (pCVar13 != (Curl_addrinfo *)0x0) {
                pCVar13->ai_next = pCVar10;
              }
              goto LAB_005271d9;
            }
LAB_005272ac:
            (*Curl_cfree)(pCVar10);
          }
          iVar9 = -10;
          goto LAB_005272c2;
        }
LAB_005271d9:
        pCVar13 = pCVar10;
        paVar14 = paVar14->ai_next;
        bVar16 = paVar14 == (addrinfo *)0x0;
      } while (!bVar16);
      iVar9 = 0;
    }
LAB_005272c2:
    if (local_38 != (addrinfo *)0x0) {
      freeaddrinfo(local_38);
    }
    if (bVar16) {
      iVar9 = (uint)(pCVar15 != (Curl_addrinfo *)0x0) * 2 + -2;
    }
    else if (pCVar15 == (Curl_addrinfo *)0x0) {
      pCVar15 = (Curl_addrinfo *)0x0;
    }
    else {
      do {
        (*Curl_cfree)(pCVar15->ai_addr);
        (*Curl_cfree)(pCVar15->ai_canonname);
        pCVar13 = pCVar15->ai_next;
        (*Curl_cfree)(pCVar15);
        pCVar15 = pCVar13;
      } while (pCVar13 != (Curl_addrinfo *)0x0);
      pCVar15 = (Curl_addrinfo *)0x0;
    }
    *result = pCVar15;
  }
  return iVar9;
}

Assistant:

int
Curl_getaddrinfo_ex(const char *nodename,
                    const char *servname,
                    const struct addrinfo *hints,
                    Curl_addrinfo **result)
{
  const struct addrinfo *ai;
  struct addrinfo *aihead;
  Curl_addrinfo *cafirst = NULL;
  Curl_addrinfo *calast = NULL;
  Curl_addrinfo *ca;
  size_t ss_size;
  int error;

  *result = NULL; /* assume failure */

  error = getaddrinfo(nodename, servname, hints, &aihead);
  if(error)
    return error;

  /* traverse the addrinfo list */

  for(ai = aihead; ai != NULL; ai = ai->ai_next) {

    /* ignore elements with unsupported address family, */
    /* settle family-specific sockaddr structure size.  */
    if(ai->ai_family == AF_INET)
      ss_size = sizeof(struct sockaddr_in);
#ifdef ENABLE_IPV6
    else if(ai->ai_family == AF_INET6)
      ss_size = sizeof(struct sockaddr_in6);
#endif
    else
      continue;

    /* ignore elements without required address info */
    if((ai->ai_addr == NULL) || !(ai->ai_addrlen > 0))
      continue;

    /* ignore elements with bogus address size */
    if((size_t)ai->ai_addrlen < ss_size)
      continue;

    ca = malloc(sizeof(Curl_addrinfo));
    if(!ca) {
      error = EAI_MEMORY;
      break;
    }

    /* copy each structure member individually, member ordering, */
    /* size, or padding might be different for each platform.    */

    ca->ai_flags     = ai->ai_flags;
    ca->ai_family    = ai->ai_family;
    ca->ai_socktype  = ai->ai_socktype;
    ca->ai_protocol  = ai->ai_protocol;
    ca->ai_addrlen   = (curl_socklen_t)ss_size;
    ca->ai_addr      = NULL;
    ca->ai_canonname = NULL;
    ca->ai_next      = NULL;

    ca->ai_addr = malloc(ss_size);
    if(!ca->ai_addr) {
      error = EAI_MEMORY;
      free(ca);
      break;
    }
    memcpy(ca->ai_addr, ai->ai_addr, ss_size);

    if(ai->ai_canonname != NULL) {
      ca->ai_canonname = strdup(ai->ai_canonname);
      if(!ca->ai_canonname) {
        error = EAI_MEMORY;
        free(ca->ai_addr);
        free(ca);
        break;
      }
    }

    /* if the return list is empty, this becomes the first element */
    if(!cafirst)
      cafirst = ca;

    /* add this element last in the return list */
    if(calast)
      calast->ai_next = ca;
    calast = ca;

  }

  /* destroy the addrinfo list */
  if(aihead)
    freeaddrinfo(aihead);

  /* if we failed, also destroy the Curl_addrinfo list */
  if(error) {
    Curl_freeaddrinfo(cafirst);
    cafirst = NULL;
  }
  else if(!cafirst) {
#ifdef EAI_NONAME
    /* rfc3493 conformant */
    error = EAI_NONAME;
#else
    /* rfc3493 obsoleted */
    error = EAI_NODATA;
#endif
#ifdef USE_WINSOCK
    SET_SOCKERRNO(error);
#endif
  }

  *result = cafirst;

  /* This is not a CURLcode */
  return error;
}